

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotree.hpp
# Opt level: O2

void __thiscall
ImputedData<long,long_double>::ImputedData<InputData<float,long>>
          (ImputedData<long,long_double> *this,InputData<float,_long> *input_data,size_t row)

{
  memset(this,0,0xd8);
  initialize_impute_calc<ImputedData<long,long_double>,InputData<float,long>>
            ((ImputedData<long,_long_double> *)this,input_data,row);
  return;
}

Assistant:

ImputedData(InputData &input_data, size_t row)
    {
        initialize_impute_calc(*this, input_data, row);
    }